

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commands.cpp
# Opt level: O2

void * CommandsThread(void *pParam)

{
  char *pcVar1;
  char line [256];
  
  puts("Type a command (e.g. help) or exit to terminate the program.");
  do {
    memset(line,0,0x100);
    pcVar1 = fgets3(_stdin,line,0x100);
    if (pcVar1 == (char *)0x0) {
      if (bExit != 0) {
        return (void *)0x0;
      }
      puts("Invalid command or stdin failure.");
      mSleep(100);
    }
    else {
      if (bExit != 0) {
        return (void *)0x0;
      }
      Commands(line);
    }
  } while (bExit == 0);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE CommandsThread(void* pParam)
{
	char line[MAX_BUF_LEN];

	UNREFERENCED_PARAMETER(pParam);

	printf("Type a command (e.g. help) or exit to terminate the program.\n");

	// Read and execute commands from stdin.
	for (;;)
	{
		// fgets() should be a blocking call.
		// How to cancel it properly?

		memset(line, 0, sizeof(line));
		if (fgets3(stdin, line, sizeof(line)) != NULL)
		{
			if (bExit) break;
			Commands(line);
		}
		else
		{
			if (bExit) break;
			printf("Invalid command or stdin failure.\n");
			mSleep(100);
		}

		if (bExit) break;
	}

	return 0;
}